

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFFileSpecObjectHelper::QPDFFileSpecObjectHelper
          (QPDFFileSpecObjectHelper *this,QPDFObjectHandle *oh)

{
  bool bVar1;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  QPDFObjectHandle local_28;
  QPDFObjectHandle *local_18;
  QPDFObjectHandle *oh_local;
  QPDFFileSpecObjectHelper *this_local;
  
  local_18 = oh;
  oh_local = (QPDFObjectHandle *)this;
  QPDFObjectHandle::QPDFObjectHandle(&local_28,oh);
  QPDFObjectHelper::QPDFObjectHelper(&this->super_QPDFObjectHelper,&local_28);
  QPDFObjectHandle::~QPDFObjectHandle(&local_28);
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFFileSpecObjectHelper_00590550;
  std::shared_ptr<QPDFFileSpecObjectHelper::Members>::shared_ptr(&this->m);
  bVar1 = QPDFObjectHandle::isDictionary(oh);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"/Filespec",&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
    bVar1 = QPDFObjectHandle::isDictionaryOfType(oh,&local_80,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"Embedded file object\'s type is not /Filespec",&local_d1);
      QPDFObjectHandle::warnIfPossible(oh,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Embedded file object is not a dictionary",&local_59);
    QPDFObjectHandle::warnIfPossible(oh,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  return;
}

Assistant:

QPDFFileSpecObjectHelper::QPDFFileSpecObjectHelper(QPDFObjectHandle oh) :
    QPDFObjectHelper(oh)
{
    if (!oh.isDictionary()) {
        oh.warnIfPossible("Embedded file object is not a dictionary");
        return;
    }
    if (!oh.isDictionaryOfType("/Filespec")) {
        oh.warnIfPossible("Embedded file object's type is not /Filespec");
    }
}